

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::UnionVectorVerifySignature_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,EnumDef *enum_def)

{
  string name;
  string sStack_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  EscapeKeyword(&local_f8,this,(string *)enum_def);
  if ((this->opts_).super_IDLOptions.scoped_enums == true) {
    std::__cxx11::string::string((string *)&sStack_118,(string *)&local_f8);
  }
  else {
    GenTypeBasic_abi_cxx11_(&sStack_118,this,&enum_def->underlying_type,false);
  }
  std::operator+(&local_d8,"bool Verify",&local_f8);
  std::operator+(&local_b8,&local_d8,"Vector");
  std::operator+(&local_98,&local_b8,"(::flatbuffers::Verifier &verifier, ");
  std::operator+(&local_78,&local_98,
                 "const ::flatbuffers::Vector<::flatbuffers::Offset<void>> *values, ");
  std::operator+(&local_58,&local_78,"const ::flatbuffers::Vector<");
  std::operator+(&local_38,&local_58,&sStack_118);
  std::operator+(__return_storage_ptr__,&local_38,"> *types)");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&sStack_118);
  std::__cxx11::string::~string((string *)&local_f8);
  return __return_storage_ptr__;
}

Assistant:

std::string UnionVectorVerifySignature(const EnumDef &enum_def) {
    const std::string name = Name(enum_def);
    const std::string &type =
        opts_.scoped_enums ? name
                           : GenTypeBasic(enum_def.underlying_type, false);
    return "bool Verify" + name + "Vector" +
           "(::flatbuffers::Verifier &verifier, " +
           "const ::flatbuffers::Vector<::flatbuffers::Offset<void>> "
           "*values, " +
           "const ::flatbuffers::Vector<" + type + "> *types)";
  }